

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O2

void __thiscall
cm::uv_handle_ptr_base_<uv_process_s>::allocate(uv_handle_ptr_base_<uv_process_s> *this,void *data)

{
  void *pvVar1;
  
  std::__shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2> *)this);
  pvVar1 = calloc(1,0x88);
  std::__shared_ptr<uv_process_s,(__gnu_cxx::_Lock_policy)2>::
  reset<uv_process_s,cm::uv_handle_deleter<uv_process_s>>
            ((__shared_ptr<uv_process_s,(__gnu_cxx::_Lock_policy)2> *)this,pvVar1);
  ((this->handle).super___shared_ptr<uv_process_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data = data;
  return;
}

Assistant:

void uv_handle_ptr_base_<T>::allocate(void* data)
{
  reset();

  /*
    We use calloc since we know all these types are c structs
    and we just want to 0 init them. New would do the same thing;
    but casting from uv_handle_t to certain other types -- namely
    uv_timer_t -- triggers a cast_align warning on certain systems.
  */
  handle.reset(static_cast<T*>(calloc(1, sizeof(T))), uv_handle_deleter<T>());
  handle->data = data;
}